

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_gen_blind(void)

{
  int iVar1;
  secp256k1_ge pge;
  secp256k1_gej i;
  secp256k1_gej pgej2;
  secp256k1_gej pgej;
  uchar seed32 [32];
  secp256k1_scalar b;
  secp256k1_scalar key;
  uchar *in_stack_fffffffffffffdc0;
  secp256k1_scalar *in_stack_fffffffffffffde0;
  secp256k1_gej *in_stack_fffffffffffffe08;
  secp256k1_ge *in_stack_fffffffffffffe10;
  undefined1 local_1e8 [96];
  secp256k1_gej *in_stack_fffffffffffffe78;
  secp256k1_ge *in_stack_fffffffffffffe80;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  secp256k1_gej *in_stack_fffffffffffffe98;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffea0;
  secp256k1_gej *in_stack_fffffffffffffeb8;
  secp256k1_gej *in_stack_fffffffffffffec0;
  uchar *in_stack_ffffffffffffff28;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffff30;
  secp256k1_scalar local_40 [2];
  
  random_scalar_order_test(in_stack_fffffffffffffde0);
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  secp256k1_testrand256(in_stack_fffffffffffffdc0);
  local_40[0].d[0] = (CTX->ecmult_gen_ctx).blind.d[0];
  local_40[0].d[1] = (CTX->ecmult_gen_ctx).blind.d[1];
  local_40[0].d[2] = (CTX->ecmult_gen_ctx).blind.d[2];
  local_40[0].d[3] = (CTX->ecmult_gen_ctx).blind.d[3];
  memcpy(local_1e8,&(CTX->ecmult_gen_ctx).initial,0x80);
  secp256k1_ecmult_gen_blind(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iVar1 = secp256k1_scalar_eq(local_40,&(CTX->ecmult_gen_ctx).blind);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x16a7,"test condition failed: !secp256k1_scalar_eq(&b, &CTX->ecmult_gen_ctx.blind)");
    abort();
  }
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  iVar1 = gej_xyz_equals_gej(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x16a9,"test condition failed: !gej_xyz_equals_gej(&pgej, &pgej2)");
    abort();
  }
  iVar1 = gej_xyz_equals_gej(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x16aa,"test condition failed: !gej_xyz_equals_gej(&i, &CTX->ecmult_gen_ctx.initial)");
    abort();
  }
  secp256k1_ge_set_gej(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  ge_equals_gej(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  return;
}

Assistant:

static void test_ecmult_gen_blind(void) {
    /* Test ecmult_gen() blinding and confirm that the blinding changes, the affine points match, and the z's don't match. */
    secp256k1_scalar key;
    secp256k1_scalar b;
    unsigned char seed32[32];
    secp256k1_gej pgej;
    secp256k1_gej pgej2;
    secp256k1_gej i;
    secp256k1_ge pge;
    random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pgej, &key);
    secp256k1_testrand256(seed32);
    b = CTX->ecmult_gen_ctx.blind;
    i = CTX->ecmult_gen_ctx.initial;
    secp256k1_ecmult_gen_blind(&CTX->ecmult_gen_ctx, seed32);
    CHECK(!secp256k1_scalar_eq(&b, &CTX->ecmult_gen_ctx.blind));
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pgej2, &key);
    CHECK(!gej_xyz_equals_gej(&pgej, &pgej2));
    CHECK(!gej_xyz_equals_gej(&i, &CTX->ecmult_gen_ctx.initial));
    secp256k1_ge_set_gej(&pge, &pgej);
    ge_equals_gej(&pge, &pgej2);
}